

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

Timer * __thiscall Allocator::construct<CompilerStatistics::Timer>(Allocator *this,int count)

{
  int iVar1;
  undefined4 extraout_var;
  Timer *local_38;
  void *tmp;
  int count_local;
  Allocator *this_local;
  Timer *pTVar2;
  
  iVar1 = (*this->_vptr_Allocator[2])(this,(ulong)(count * 0x28 + 4));
  pTVar2 = (Timer *)CONCAT44(extraout_var,iVar1);
  if ((long)count != 0) {
    local_38 = pTVar2;
    do {
      CompilerStatistics::Timer::Timer(local_38);
      local_38 = local_38 + 1;
    } while (local_38 != pTVar2 + count);
  }
  return pTVar2;
}

Assistant:

T* construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}